

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_rational.hpp
# Opt level: O1

void soplex::LPFwriteRow(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                         *p_lp,ostream *p_output,NameSet *p_cnames,
                        SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                        *p_svec,Rational *p_lhs,Rational *p_rhs,SPxOut *spxout)

{
  bool bVar1;
  bool bVar2;
  double dVar3;
  Rational *this;
  int iVar4;
  long lVar5;
  double *pdVar6;
  long lVar7;
  char *pcVar8;
  Verbosity old_verbosity;
  double result;
  double local_68;
  string local_60;
  pointer local_40;
  Rational *local_38;
  
  lVar5 = std::ostream::tellp();
  LPFwriteSVector(p_lp,p_output,p_cnames,p_svec,spxout,false);
  iVar4 = boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::compare(&p_lhs->m_backend,&p_rhs->m_backend);
  local_38 = p_lhs;
  if (iVar4 == 0) {
LAB_001783a9:
    bVar1 = false;
    boost::multiprecision::backends::
    rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
    ::str_abi_cxx11_(&local_60,
                     (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                      *)p_rhs,0,~(_S_ios_fmtflags_min|_S_ios_fmtflags_max));
    bVar2 = true;
  }
  else {
    local_60._M_dataplus._M_p = (pointer)0x0;
    boost::multiprecision::detail::
    generic_convert_rational_to_float<double,boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>>
              ((double *)&local_60,&p_lhs->m_backend);
    local_40 = local_60._M_dataplus._M_p;
    ::soplex::infinity::__tls_init();
    pdVar6 = (double *)__tls_get_addr(&PTR_003b6b60);
    if ((double)local_40 <= -*pdVar6) goto LAB_001783a9;
    bVar2 = false;
    boost::multiprecision::backends::
    rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
    ::str_abi_cxx11_(&local_60,
                     (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                      *)p_lhs,0,~(_S_ios_fmtflags_min|_S_ios_fmtflags_max));
    bVar1 = true;
  }
  if ((bVar1) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2)) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  this = local_38;
  if ((bVar2) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2)) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  lVar7 = std::ostream::tellp();
  if (0xff9c < (long)((local_60._M_string_length - lVar5) + lVar7)) {
    std::__ostream_insert<char,std::char_traits<char>>(p_output,"\n\t",2);
    lVar7 = std::ostream::tellp();
    if (((spxout != (SPxOut *)0x0) && (0x10000 < lVar7 - lVar5)) && (0 < (int)spxout->m_verbosity))
    {
      local_68 = (double)CONCAT44(local_68._4_4_,spxout->m_verbosity);
      (*spxout->_vptr_SPxOut[2])(spxout);
      std::__ostream_insert<char,std::char_traits<char>>
                (spxout->m_streams[spxout->m_verbosity],
                 "XLPSWR02 Warning: SOPLEX_MAX_LINE_WRITE_LEN possibly exceeded when writing LP file\n"
                 ,0x53);
      (*spxout->_vptr_SPxOut[2])(spxout,&local_68);
    }
    lVar5 = std::ostream::tellp();
  }
  iVar4 = boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::compare(&this->m_backend,&p_rhs->m_backend);
  if (iVar4 == 0) {
    pcVar8 = " = ";
    lVar7 = 3;
  }
  else {
    local_68 = 0.0;
    boost::multiprecision::detail::
    generic_convert_rational_to_float<double,boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>>
              (&local_68,&this->m_backend);
    dVar3 = local_68;
    ::soplex::infinity::__tls_init();
    pdVar6 = (double *)__tls_get_addr(&PTR_003b6b60);
    if (-*pdVar6 < dVar3) {
      std::__ostream_insert<char,std::char_traits<char>>(p_output," >= ",4);
      p_rhs = this;
      goto LAB_00178552;
    }
    pcVar8 = " <= ";
    lVar7 = 4;
  }
  std::__ostream_insert<char,std::char_traits<char>>(p_output,pcVar8,lVar7);
LAB_00178552:
  boost::multiprecision::operator<<(p_output,p_rhs);
  std::__ostream_insert<char,std::char_traits<char>>(p_output,"\n",1);
  lVar7 = std::ostream::tellp();
  if (((spxout != (SPxOut *)0x0) && (0x10000 < lVar7 - lVar5)) && (0 < (int)spxout->m_verbosity)) {
    local_68 = (double)CONCAT44(local_68._4_4_,spxout->m_verbosity);
    (*spxout->_vptr_SPxOut[2])(spxout);
    std::__ostream_insert<char,std::char_traits<char>>
              (spxout->m_streams[spxout->m_verbosity],
               "XLPSWR03 Warning: SOPLEX_MAX_LINE_WRITE_LEN possibly exceeded when writing LP file\n"
               ,0x53);
    (*spxout->_vptr_SPxOut[2])(spxout,&local_68);
  }
  return;
}

Assistant:

static void LPFwriteRow(
   const SPxLPBase<Rational>&   p_lp,       ///< the LP
   std::ostream&            p_output,   ///< output stream
   const NameSet*           p_cnames,   ///< column names
   const SVectorBase<Rational>& p_svec,     ///< vector of the row
   const Rational&              p_lhs,      ///< lhs of the row
   const Rational&              p_rhs,      ///< rhs of the row
   SPxOut*                      spxout      ///< out stream
)
{

   long long pos;
   pos = p_output.tellp();

   LPFwriteSVector(p_lp, p_output, p_cnames, p_svec, spxout);

   long long sidelen;
   sidelen = (p_lhs == p_rhs
              || double(p_lhs) <= double(-infinity)) ? (long long)p_rhs.str().length()
             : (long long)p_lhs.str().length();

   // insert a line break if max line length is in danger of being exceeded
   if((long long)(p_output.tellp()) - pos + sidelen + (long long)100 > SOPLEX_MAX_LINE_WRITE_LEN)
   {
      p_output << "\n\t";

      if((long long)(p_output.tellp()) - pos  >  SOPLEX_MAX_LINE_WRITE_LEN)
      {
         SPX_MSG_WARNING((*spxout), (*spxout) <<
                         "XLPSWR02 Warning: SOPLEX_MAX_LINE_WRITE_LEN possibly exceeded when writing LP file\n");
      }

      pos = p_output.tellp();
   }

   // write bound value
   if(p_lhs == p_rhs)
      p_output << " = " << p_rhs;
   else if(double(p_lhs) <= double(-infinity))
      p_output << " <= " << p_rhs;
   else
   {
      assert(double(p_rhs) >= double(infinity));
      p_output << " >= " << p_lhs;
   }

   p_output << "\n";

   if((long long)(p_output.tellp()) - pos  >  SOPLEX_MAX_LINE_WRITE_LEN)
   {
      SPX_MSG_WARNING((*spxout), (*spxout) <<
                      "XLPSWR03 Warning: SOPLEX_MAX_LINE_WRITE_LEN possibly exceeded when writing LP file\n");
   }
}